

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bones.c
# Opt level: O0

boolean no_bones_level(d_level *lev)

{
  char cVar1;
  boolean bVar2;
  xchar xVar3;
  s_level *psVar4;
  branch *pbVar5;
  bool local_1a;
  bool local_19;
  s_level *sptr;
  d_level *lev_local;
  
  psVar4 = Is_special(lev);
  if (((psVar4 == (s_level *)0x0) || (local_19 = true, psVar4->boneid != '\0')) &&
     (local_19 = true, dungeons[lev->dnum].boneid != '\0')) {
    bVar2 = Is_botlevel(lev);
    local_19 = true;
    if (bVar2 == '\0') {
      pbVar5 = Is_branchlev(lev);
      if ((pbVar5 == (branch *)0x0) || (local_19 = true, lev->dlevel < '\x02')) {
        bVar2 = In_hell(lev);
        local_1a = false;
        if (bVar2 != '\0') {
          cVar1 = lev->dlevel;
          xVar3 = dunlevs_in_dungeon(lev);
          local_1a = (int)cVar1 == xVar3 + -1;
        }
        local_19 = local_1a;
      }
    }
  }
  return local_19;
}

Assistant:

static boolean no_bones_level(d_level *lev)
{
	s_level *sptr;

	return (boolean)(((sptr = Is_special(lev)) != 0 && !sptr->boneid)
		|| !dungeons[lev->dnum].boneid
		   /* no bones on the last or multiway branch levels */
		   /* in any dungeon (level 1 isn't multiway).       */
		|| Is_botlevel(lev) || (Is_branchlev(lev) && lev->dlevel > 1)
		   /* no bones in the invocation level               */
		|| (In_hell(lev) && lev->dlevel == dunlevs_in_dungeon(lev) - 1)
		);
}